

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_des.c
# Opt level: O0

int des_ctrl(EVP_CIPHER_CTX *c,int type,int arg,void *ptr)

{
  int iVar1;
  DES_cblock *in_RCX;
  int in_ESI;
  uchar *in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  if (in_ESI == 6) {
    iVar1 = RAND_priv_bytes(in_stack_ffffffffffffffd8,0);
    if (iVar1 < 1) {
      local_4 = 0;
    }
    else {
      DES_set_odd_parity(in_RCX);
      local_4 = 1;
    }
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

static int des_ctrl(EVP_CIPHER_CTX *c, int type, int arg, void *ptr)
{

    switch (type) {
    case EVP_CTRL_RAND_KEY:
        if (RAND_priv_bytes(ptr, 8) <= 0)
            return 0;
        DES_set_odd_parity((DES_cblock *)ptr);
        return 1;

    default:
        return -1;
    }
}